

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

void rw::V3d::transformPoints(V3d *out,V3d *in,int32 n,Matrix *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  long lVar12;
  
  if (0 < n) {
    lVar12 = 0;
    do {
      fVar1 = *(float *)((long)&in->x + lVar12);
      fVar2 = *(float *)((long)&in->y + lVar12);
      fVar3 = *(float *)((long)&in->z + lVar12);
      fVar4 = (float)(m->up).y;
      fVar5 = (float)(m->right).y;
      fVar6 = (float)(m->at).y;
      fVar7 = (float)(m->pos).y;
      fVar8 = (float)(m->up).z;
      fVar9 = (float)(m->right).z;
      fVar10 = (float)(m->at).z;
      fVar11 = (float)(m->pos).z;
      *(float *)((long)&out->x + lVar12) =
           (float)(m->at).x * fVar3 + (float)(m->right).x * fVar1 + (float)(m->up).x * fVar2 +
           (float)(m->pos).x;
      *(float *)((long)&out->y + lVar12) = fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2 + fVar7;
      *(float *)((long)&out->z + lVar12) = fVar3 * fVar10 + fVar1 * fVar9 + fVar2 * fVar8 + fVar11;
      lVar12 = lVar12 + 0xc;
    } while ((ulong)(uint)n * 0xc != lVar12);
  }
  return;
}

Assistant:

void
V3d::transformPoints(V3d *out, const V3d *in, int32 n, const Matrix *m)
{
	int32 i;
	V3d tmp;
	for(i = 0; i < n; i++){
		tmp.x = in[i].x*m->right.x + in[i].y*m->up.x + in[i].z*m->at.x + m->pos.x;
		tmp.y = in[i].x*m->right.y + in[i].y*m->up.y + in[i].z*m->at.y + m->pos.y;
		tmp.z = in[i].x*m->right.z + in[i].y*m->up.z + in[i].z*m->at.z + m->pos.z;
		out[i] = tmp;
	}
}